

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::reorderPatternsByPartition
          (BeagleCPUImpl<double,_1,_0> *this)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  int *piVar4;
  int **ppiVar5;
  double *pdVar6;
  double **ppdVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined8 uVar11;
  byte bVar12;
  byte bVar13;
  int *piVar14;
  void *__ptr;
  double *pdVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  ulong uVar22;
  long lVar23;
  int iVar24;
  int iVar25;
  double *pdVar26;
  double *pdVar27;
  ushort uVar28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  void *ptr;
  double *local_38;
  
  iVar18 = -7;
  if (this->kPatternsReordered == false) {
    iVar18 = this->kPatternCount;
    piVar14 = (int *)malloc((long)iVar18 * 4);
    this->gPatternsNewOrder = piVar14;
    iVar24 = this->kPartitionCount;
    __ptr = malloc((long)iVar24 * 4);
    pdVar15 = (double *)malloc((long)iVar18 << 3);
    if (0 < (long)iVar24) {
      piVar3 = this->gPatternPartitionsStartPatterns;
      lVar19 = 0;
      do {
        piVar3[lVar19] = 0;
        *(undefined4 *)((long)__ptr + lVar19 * 4) = 0;
        lVar19 = lVar19 + 1;
      } while (lVar19 < this->kPartitionCount);
    }
    iVar18 = this->kPatternCount;
    if (0 < (long)iVar18) {
      piVar3 = this->gPatternPartitions;
      lVar19 = 0;
      do {
        iVar24 = *(int *)((long)__ptr + (long)piVar3[lVar19] * 4);
        *(int *)((long)__ptr + (long)piVar3[lVar19] * 4) = iVar24 + 1;
        piVar14[lVar19] = iVar24;
        lVar19 = lVar19 + 1;
      } while (iVar18 != lVar19);
    }
    iVar18 = this->kPartitionCount;
    if (0 < iVar18) {
      piVar3 = this->gPatternPartitionsStartPatterns;
      uVar17 = 0xf;
      lVar19 = 0;
      auVar30 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar31 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        if (lVar19 != 0) {
          auVar35 = ZEXT464((uint)piVar3[lVar19]);
          auVar32 = vpbroadcastq_avx512f();
          uVar22 = 0;
          do {
            auVar33 = vmovdqa64_avx512f(auVar35);
            auVar35 = vpbroadcastq_avx512f();
            auVar34 = vporq_avx512f(auVar35,auVar30);
            auVar35 = vporq_avx512f(auVar35,auVar31);
            uVar11 = vpcmpuq_avx512f(auVar35,auVar32,2);
            bVar12 = (byte)uVar11;
            uVar11 = vpcmpuq_avx512f(auVar34,auVar32,2);
            bVar13 = (byte)uVar11;
            uVar28 = CONCAT11(bVar13,bVar12);
            auVar35 = vmovdqu32_avx512f(*(undefined1 (*) [64])((long)__ptr + uVar22 * 4));
            auVar34._4_4_ = (uint)((byte)(uVar28 >> 1) & 1) * auVar35._4_4_;
            auVar34._0_4_ = (uint)(bVar12 & 1) * auVar35._0_4_;
            auVar34._8_4_ = (uint)((byte)(uVar28 >> 2) & 1) * auVar35._8_4_;
            auVar34._12_4_ = (uint)((byte)(uVar28 >> 3) & 1) * auVar35._12_4_;
            auVar34._16_4_ = (uint)((byte)(uVar28 >> 4) & 1) * auVar35._16_4_;
            auVar34._20_4_ = (uint)((byte)(uVar28 >> 5) & 1) * auVar35._20_4_;
            auVar34._24_4_ = (uint)((byte)(uVar28 >> 6) & 1) * auVar35._24_4_;
            auVar34._28_4_ = (uint)((byte)(uVar28 >> 7) & 1) * auVar35._28_4_;
            auVar34._32_4_ = (uint)(bVar13 & 1) * auVar35._32_4_;
            auVar34._36_4_ = (uint)(bVar13 >> 1 & 1) * auVar35._36_4_;
            auVar34._40_4_ = (uint)(bVar13 >> 2 & 1) * auVar35._40_4_;
            auVar34._44_4_ = (uint)(bVar13 >> 3 & 1) * auVar35._44_4_;
            auVar34._48_4_ = (uint)(bVar13 >> 4 & 1) * auVar35._48_4_;
            auVar34._52_4_ = (uint)(bVar13 >> 5 & 1) * auVar35._52_4_;
            auVar34._56_4_ = (uint)(bVar13 >> 6 & 1) * auVar35._56_4_;
            auVar34._60_4_ = (uint)(bVar13 >> 7) * auVar35._60_4_;
            auVar35 = vpaddd_avx512f(auVar33,auVar34);
            uVar22 = uVar22 + 0x10;
          } while ((uVar17 & 0xfffffffffffffff0) != uVar22);
          auVar32 = vmovdqa32_avx512f(auVar35);
          auVar35._0_4_ =
               (uint)(bVar12 & 1) * auVar32._0_4_ | (uint)!(bool)(bVar12 & 1) * auVar33._0_4_;
          bVar8 = (bool)((byte)(uVar28 >> 1) & 1);
          auVar35._4_4_ = (uint)bVar8 * auVar32._4_4_ | (uint)!bVar8 * auVar33._4_4_;
          bVar8 = (bool)((byte)(uVar28 >> 2) & 1);
          auVar35._8_4_ = (uint)bVar8 * auVar32._8_4_ | (uint)!bVar8 * auVar33._8_4_;
          bVar8 = (bool)((byte)(uVar28 >> 3) & 1);
          auVar35._12_4_ = (uint)bVar8 * auVar32._12_4_ | (uint)!bVar8 * auVar33._12_4_;
          bVar8 = (bool)((byte)(uVar28 >> 4) & 1);
          auVar35._16_4_ = (uint)bVar8 * auVar32._16_4_ | (uint)!bVar8 * auVar33._16_4_;
          bVar8 = (bool)((byte)(uVar28 >> 5) & 1);
          auVar35._20_4_ = (uint)bVar8 * auVar32._20_4_ | (uint)!bVar8 * auVar33._20_4_;
          bVar8 = (bool)((byte)(uVar28 >> 6) & 1);
          auVar35._24_4_ = (uint)bVar8 * auVar32._24_4_ | (uint)!bVar8 * auVar33._24_4_;
          bVar8 = (bool)((byte)(uVar28 >> 7) & 1);
          auVar35._28_4_ = (uint)bVar8 * auVar32._28_4_ | (uint)!bVar8 * auVar33._28_4_;
          auVar35._32_4_ =
               (uint)(bVar13 & 1) * auVar32._32_4_ | (uint)!(bool)(bVar13 & 1) * auVar33._32_4_;
          bVar8 = (bool)(bVar13 >> 1 & 1);
          auVar35._36_4_ = (uint)bVar8 * auVar32._36_4_ | (uint)!bVar8 * auVar33._36_4_;
          bVar8 = (bool)(bVar13 >> 2 & 1);
          auVar35._40_4_ = (uint)bVar8 * auVar32._40_4_ | (uint)!bVar8 * auVar33._40_4_;
          bVar8 = (bool)(bVar13 >> 3 & 1);
          auVar35._44_4_ = (uint)bVar8 * auVar32._44_4_ | (uint)!bVar8 * auVar33._44_4_;
          bVar8 = (bool)(bVar13 >> 4 & 1);
          auVar35._48_4_ = (uint)bVar8 * auVar32._48_4_ | (uint)!bVar8 * auVar33._48_4_;
          bVar8 = (bool)(bVar13 >> 5 & 1);
          auVar35._52_4_ = (uint)bVar8 * auVar32._52_4_ | (uint)!bVar8 * auVar33._52_4_;
          bVar8 = (bool)(bVar13 >> 6 & 1);
          auVar35._56_4_ = (uint)bVar8 * auVar32._56_4_ | (uint)!bVar8 * auVar33._56_4_;
          auVar35._60_4_ =
               (uint)(bVar13 >> 7) * auVar32._60_4_ | (uint)!(bool)(bVar13 >> 7) * auVar33._60_4_;
          auVar29 = vextracti64x4_avx512f(auVar35,1);
          auVar32 = vpaddd_avx512f(auVar35,ZEXT3264(auVar29));
          auVar9 = vpaddd_avx(auVar32._0_16_,auVar32._16_16_);
          auVar10 = vpshufd_avx(auVar9,0xee);
          auVar9 = vpaddd_avx(auVar9,auVar10);
          auVar10 = vpshufd_avx(auVar9,0x55);
          auVar9 = vpaddd_avx(auVar9,auVar10);
          piVar3[lVar19] = auVar9._0_4_;
        }
        lVar19 = lVar19 + 1;
        iVar18 = this->kPartitionCount;
        uVar17 = uVar17 + 1;
      } while (lVar19 < iVar18);
    }
    piVar3 = this->gPatternPartitionsStartPatterns;
    piVar3[iVar18] = this->kPatternCount;
    iVar18 = this->kPatternCount;
    if (0 < (long)iVar18) {
      pdVar27 = this->gPatternWeights;
      piVar4 = this->gPatternPartitions;
      lVar19 = 0;
      do {
        lVar23 = (long)piVar14[lVar19] + (long)piVar3[piVar4[lVar19]];
        piVar14[lVar19] = (int)lVar23;
        pdVar15[lVar23] = pdVar27[lVar19];
        lVar19 = lVar19 + 1;
      } while (iVar18 != lVar19);
    }
    if (0 < this->kPartitionCount) {
      piVar14 = this->gPatternPartitions;
      lVar19 = 0;
      iVar18 = 0;
      do {
        iVar24 = *(int *)((long)__ptr + lVar19 * 4);
        if (0 < iVar24) {
          lVar23 = 0;
          do {
            piVar14[iVar18 + lVar23] = (int)lVar19;
            lVar23 = lVar23 + 1;
          } while (iVar24 != (int)lVar23);
          iVar18 = iVar18 + (int)lVar23;
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 < this->kPartitionCount);
    }
    free(__ptr);
    free(this->gPatternWeights);
    this->gPatternWeights = pdVar15;
    local_38 = (double *)0x0;
    posix_memalign(&local_38,0x20,(long)this->kPartialsSize << 3);
    pdVar15 = local_38;
    local_38 = (double *)0x0;
    posix_memalign(&local_38,0x20,(long)this->kPaddedPatternCount << 2);
    pdVar27 = local_38;
    if (0 < this->kTipCount) {
      lVar19 = 0;
      pdVar26 = pdVar15;
      do {
        ppiVar5 = this->gTipStates;
        pdVar6 = (double *)ppiVar5[lVar19];
        if (pdVar6 == (double *)0x0) {
          ppdVar7 = this->gPartials;
          pdVar15 = ppdVar7[lVar19];
          iVar18 = this->kCategoryCount;
          if (0 < iVar18) {
            uVar1 = this->kPatternCount;
            uVar2 = this->kStateCount;
            iVar24 = 0;
            iVar25 = 0;
            do {
              if (0 < (int)uVar1) {
                piVar14 = this->gPatternsNewOrder;
                uVar17 = 0;
                iVar21 = iVar24;
                do {
                  if (0 < (int)uVar2) {
                    iVar16 = piVar14[uVar17] * uVar2 + iVar24;
                    uVar22 = (ulong)uVar2;
                    iVar20 = iVar21;
                    do {
                      pdVar26[iVar16] = pdVar15[iVar20];
                      iVar16 = iVar16 + 1;
                      iVar20 = iVar20 + 1;
                      uVar22 = uVar22 - 1;
                    } while (uVar22 != 0);
                  }
                  uVar17 = uVar17 + 1;
                  iVar21 = iVar21 + uVar2;
                } while (uVar17 != uVar1);
              }
              iVar25 = iVar25 + 1;
              iVar24 = iVar24 + uVar1 * uVar2;
            } while (iVar25 != iVar18);
          }
          ppdVar7[lVar19] = pdVar26;
        }
        else {
          if (0 < this->kPatternCount) {
            piVar14 = this->gPatternsNewOrder;
            lVar23 = 0;
            do {
              *(int *)((long)pdVar27 + (long)piVar14[lVar23] * 4) =
                   *(int *)((long)pdVar6 + lVar23 * 4);
              lVar23 = lVar23 + 1;
            } while (lVar23 < this->kPatternCount);
          }
          ppiVar5[lVar19] = (int *)pdVar27;
          pdVar15 = pdVar26;
          pdVar27 = pdVar6;
        }
        lVar19 = lVar19 + 1;
        pdVar26 = pdVar15;
      } while (lVar19 < this->kTipCount);
    }
    free(pdVar15);
    free(pdVar27);
    this->kPatternsReordered = true;
    iVar18 = 0;
  }
  return iVar18;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::reorderPatternsByPartition() {

    if (!kPatternsReordered) {
        gPatternsNewOrder = (int*) malloc(kPatternCount * sizeof(int));
    } else {
        return BEAGLE_ERROR_NO_IMPLEMENTATION;
    }

    int* partitionSizes = (int*) malloc(kPartitionCount * sizeof(int));
    double* sortedPatternWeights = (double*) malloc(sizeof(double) * kPatternCount);

    for (int i=0; i < kPartitionCount; i++) {
        gPatternPartitionsStartPatterns[i] = 0;
        partitionSizes[i] = 0;
    }

    for (int i=0; i < kPatternCount; i++) {
         gPatternsNewOrder[i] = partitionSizes[gPatternPartitions[i]]++;
    }

    for (int i=0; i < kPartitionCount; i++) {
        for (int j=0; j < i; j++) {
            gPatternPartitionsStartPatterns[i] += partitionSizes[j];
        }
    }
    gPatternPartitionsStartPatterns[kPartitionCount] = kPatternCount;

    for (int i=0; i < kPatternCount; i++) {
        gPatternsNewOrder[i] += gPatternPartitionsStartPatterns[gPatternPartitions[i]];
        sortedPatternWeights[gPatternsNewOrder[i]] = gPatternWeights[i];
    }


    int currentPattern = 0;
    for (int i=0; i < kPartitionCount; i++) {
        for (int j=0; j < partitionSizes[i]; j++) {
            gPatternPartitions[currentPattern++] = i;
        }
    }

    free(partitionSizes);
    free(gPatternWeights);
    gPatternWeights = sortedPatternWeights;

    REALTYPE* sortedPartials = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPartialsSize);
    int* sortedTips = (int*) mallocAligned(sizeof(int) * kPaddedPatternCount);

    for (int tip=0; tip < kTipCount; tip++) {
        if (gTipStates[tip] == NULL) {
            REALTYPE* unsortedPartials = gPartials[tip];
            for (int l=0; l < kCategoryCount; l++) {
                for (int i=0; i < kPatternCount; i++) {
                    for (int j=0; j < kStateCount; j++) {
                        int sortIndex = l*kStateCount*kPatternCount + gPatternsNewOrder[i]*kStateCount + j;
                        int pIndex = l*kStateCount*kPatternCount + i*kStateCount + j;
                        sortedPartials[sortIndex] = unsortedPartials[pIndex];
                    }
                }
            }
            gPartials[tip] = sortedPartials;
            sortedPartials = unsortedPartials;
        } else {
            int* unsortedTips = gTipStates[tip];
            for (int i=0; i < kPatternCount; i++) {
                int sortIndex = gPatternsNewOrder[i];
                int pIndex = i;
                sortedTips[sortIndex] = unsortedTips[pIndex];
            }
            gTipStates[tip] = sortedTips;
            sortedTips = unsortedTips;
        }
    }

    free(sortedPartials);
    free(sortedTips);

    kPatternsReordered = true;

    return BEAGLE_SUCCESS;
}